

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O2

FT_Error sdf_conic_to(FT_26D6_Vec *control_1,FT_26D6_Vec *to,void *user)

{
  long *plVar1;
  long lVar2;
  FT_Pos FVar3;
  FT_Error FVar4;
  SDF_Edge *edge;
  
  edge = (SDF_Edge *)0x0;
  if (to == (FT_26D6_Vec *)0x0 || control_1 == (FT_26D6_Vec *)0x0) {
    FVar4 = 6;
  }
  else {
    plVar1 = *(long **)((long)user + 8);
    if (((*plVar1 == control_1->x) && (plVar1[1] == control_1->y)) ||
       ((control_1->x == to->x && (control_1->y == to->y)))) {
      sdf_line_to(to,user);
    }
    else {
      FVar4 = sdf_edge_new(*user,&edge);
      if (FVar4 != 0) {
        return FVar4;
      }
      edge->edge_type = SDF_EDGE_CONIC;
      lVar2 = plVar1[1];
      (edge->start_pos).x = *plVar1;
      (edge->start_pos).y = lVar2;
      FVar3 = control_1->y;
      (edge->control_a).x = control_1->x;
      (edge->control_a).y = FVar3;
      FVar3 = to->y;
      (edge->end_pos).x = to->x;
      (edge->end_pos).y = FVar3;
      edge->next = (SDF_Edge_ *)plVar1[2];
      plVar1[2] = (long)edge;
      lVar2 = to->y;
      *plVar1 = to->x;
      plVar1[1] = lVar2;
    }
    FVar4 = 0;
  }
  return FVar4;
}

Assistant:

static FT_Error
  sdf_conic_to( const FT_26D6_Vec*  control_1,
                const FT_26D6_Vec*  to,
                void*               user )
  {
    SDF_Shape*    shape    = ( SDF_Shape* )user;
    SDF_Edge*     edge     = NULL;
    SDF_Contour*  contour  = NULL;

    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = shape->memory;


    if ( !control_1 || !to || !user )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    contour = shape->contours;

    /* If the control point coincides with any of the end points */
    /* then it is a line and should be treated as one to avoid   */
    /* unnecessary complexity later in the algorithm.            */
    if ( ( contour->last_pos.x == control_1->x &&
           contour->last_pos.y == control_1->y ) ||
         ( control_1->x == to->x &&
           control_1->y == to->y )               )
    {
      sdf_line_to( to, user );
      goto Exit;
    }

    FT_CALL( sdf_edge_new( memory, &edge ) );

    edge->edge_type = SDF_EDGE_CONIC;
    edge->start_pos = contour->last_pos;
    edge->control_a = *control_1;
    edge->end_pos   = *to;

    edge->next        = contour->edges;
    contour->edges    = edge;
    contour->last_pos = *to;

  Exit:
    return error;
  }